

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcSymbol * __thiscall CTcPrsSymtab::find_delete_weak(CTcPrsSymtab *this,char *name,size_t len)

{
  CTcSymbol *pCVar1;
  
  pCVar1 = find(this,name,len);
  if (pCVar1 != (CTcSymbol *)0x0) {
    if (*(int *)&(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 !=
        3) {
      return pCVar1;
    }
    if (((ulong)pCVar1[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                _vptr_CVmHashEntry & 0x40000) == 0) {
      return pCVar1;
    }
    (*this->_vptr_CTcPrsSymtab[4])(this,pCVar1);
  }
  return (CTcSymbol *)0x0;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_delete_weak(const char *name, size_t len)
{
    /* look up the symbol */
    CTcSymbol *sym = find(name, len);

    /* if it's a weak property definition, delete it */
    if (sym != 0
        && sym->get_type() == TC_SYM_PROP
        && ((CTcSymProp *)sym)->is_weak())
    {
        /* delete it and forget it */
        remove_entry(sym);
        sym = 0;
    }

    /* return what we found */
    return sym;
}